

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall RandStrLit::~RandStrLit(RandStrLit *this)

{
  RandStrLit *in_RDI;
  
  ~RandStrLit(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

~RandStrLit()
    {
        delete [] buf;
    }